

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O0

bool Glucose::match<char_const*>(char **in,char *str)

{
  int i;
  char *str_local;
  char **in_local;
  
  i = 0;
  while( true ) {
    if (str[i] == '\0') {
      *in = *in + i;
      return true;
    }
    if ((*in)[i] != str[i]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

static bool match(B& in, const char* str) {
    int i;
    for (i = 0; str[i] != '\0'; i++)
        if (in[i] != str[i])
            return false;

    in += i;

    return true; 
}